

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O1

void Amap_ManCreateMuxChoices
               (Amap_Man_t *p,Amap_Obj_t *pFan0,Amap_Obj_t *pFan1,Amap_Obj_t *pFanC,
               Amap_Obj_t **pChoices)

{
  Amap_Obj_t *pAVar1;
  
  pAVar1 = Amap_ManCreateMux(p,pFan0,pFan1,pFanC);
  *pChoices = pAVar1;
  pAVar1 = Amap_ManCreateMux(p,(Amap_Obj_t *)((ulong)pFan0 ^ 1),(Amap_Obj_t *)((ulong)pFan1 ^ 1),
                             pFanC);
  pChoices[1] = pAVar1;
  pAVar1 = Amap_ManCreateMux(p,pFan1,pFan0,(Amap_Obj_t *)((ulong)pFanC ^ 1));
  pChoices[2] = pAVar1;
  pAVar1 = Amap_ManCreateMux(p,(Amap_Obj_t *)((ulong)pFan1 ^ 1),(Amap_Obj_t *)((ulong)pFan0 ^ 1),
                             (Amap_Obj_t *)((ulong)pFanC ^ 1));
  pChoices[3] = pAVar1;
  return;
}

Assistant:

void Amap_ManCreateMuxChoices( Amap_Man_t * p, Amap_Obj_t * pFan0, Amap_Obj_t * pFan1, Amap_Obj_t * pFanC, Amap_Obj_t * pChoices[] )
{
    pChoices[0] = Amap_ManCreateMux( p, pFan0,           pFan1,           pFanC           );
    pChoices[1] = Amap_ManCreateMux( p, Amap_Not(pFan0), Amap_Not(pFan1), pFanC           );
    pChoices[2] = Amap_ManCreateMux( p, pFan1,           pFan0,           Amap_Not(pFanC) );
    pChoices[3] = Amap_ManCreateMux( p, Amap_Not(pFan1), Amap_Not(pFan0), Amap_Not(pFanC) );
}